

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::BasicWriter<char>::write_double<double>(BasicWriter<char> *this,double value,FormatSpec *spec)

{
  char cVar1;
  Alignment AVar2;
  wchar_t wVar3;
  Buffer<char> *pBVar4;
  char cVar5;
  char cVar6;
  uint uVar7;
  CharPtr pcVar8;
  byte *pbVar9;
  uint uVar10;
  uint uVar11;
  char *pcVar12;
  char *pcVar13;
  char cVar14;
  size_t __len;
  ulong __n;
  size_t __len_1;
  ulong uVar15;
  size_t sVar16;
  ulong uVar17;
  byte bVar18;
  bool bVar19;
  char format [10];
  char in_stack_ffffffffffffff8f;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  char local_3a [10];
  
  bVar18 = spec->type_;
  uVar10 = bVar18 - 0x41;
  if (uVar10 < 0x27) {
    if ((0x71UL >> ((ulong)uVar10 & 0x3f) & 1) == 0) {
      if ((0x7100000000U >> ((ulong)uVar10 & 0x3f) & 1) == 0) goto LAB_001587a6;
      goto LAB_00158577;
    }
    bVar19 = true;
  }
  else {
LAB_001587a6:
    if (bVar18 != 0) {
      internal::report_unknown_type
                (in_stack_ffffffffffffff8f,
                 (char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    }
    bVar18 = 0x67;
LAB_00158577:
    bVar19 = false;
  }
  if (0.0 <= value) {
    if ((spec->flags_ & 1) == 0) {
      cVar14 = '\0';
    }
    else {
      cVar14 = '+';
      if ((spec->flags_ & 2) == 0) {
        cVar14 = ' ';
      }
    }
  }
  else {
    value = -value;
    cVar14 = '-';
  }
  if (NAN(value)) {
    pcVar13 = " nan";
    if (bVar19) {
      pcVar13 = " NAN";
    }
    pcVar12 = " nan";
    if (bVar19) {
      pcVar12 = " NAN";
    }
    pcVar12 = pcVar12 + 1;
    if (cVar14 != '\0') {
      pcVar12 = pcVar13;
    }
    uVar17 = (ulong)(cVar14 != '\0');
LAB_0015860d:
    pcVar8 = write_str<char>(this,pcVar12,uVar17 + 3,&spec->super_AlignSpec);
    if (cVar14 != '\0') {
      *pcVar8 = cVar14;
    }
    return;
  }
  if (ABS(value) == INFINITY) {
    pcVar13 = " inf";
    if (bVar19) {
      pcVar13 = " INF";
    }
    pcVar12 = " inf";
    if (bVar19) {
      pcVar12 = " INF";
    }
    uVar17 = (ulong)(cVar14 != '\0');
    pcVar12 = pcVar12 + 1;
    if (cVar14 != '\0') {
      pcVar12 = pcVar13;
    }
    goto LAB_0015860d;
  }
  pBVar4 = this->buffer_;
  sVar16 = pBVar4->size_;
  uVar10 = (spec->super_AlignSpec).super_WidthSpec.width_;
  if (cVar14 != '\0') {
    if (pBVar4->capacity_ < (uVar10 + (uVar10 == 0)) + sVar16) {
      (**pBVar4->_vptr_Buffer)();
    }
    bVar19 = uVar10 == 0;
    uVar10 = uVar10 - 1;
    if (bVar19) {
      uVar10 = 0;
    }
    sVar16 = sVar16 + 1;
  }
  local_3a[0] = '%';
  if ((spec->flags_ & 8) == 0) {
    pbVar9 = (byte *)(local_3a + 1);
  }
  else {
    pbVar9 = (byte *)(local_3a + 2);
    local_3a[1] = 0x23;
  }
  AVar2 = (spec->super_AlignSpec).align_;
  if (AVar2 == ALIGN_CENTER) {
LAB_001586b9:
    uVar10 = 0;
  }
  else {
    if (AVar2 == ALIGN_LEFT) {
      *pbVar9 = 0x2d;
      pbVar9 = pbVar9 + 1;
    }
    if (uVar10 == 0) goto LAB_001586b9;
    *pbVar9 = 0x2a;
    pbVar9 = pbVar9 + 1;
  }
  if (-1 < spec->precision_) {
    pbVar9[0] = 0x2e;
    pbVar9[1] = 0x2a;
    pbVar9 = pbVar9 + 2;
  }
  *pbVar9 = bVar18;
  pbVar9[1] = 0;
  wVar3 = (spec->super_AlignSpec).super_WidthSpec.fill_;
  uVar11 = 0;
  do {
    pcVar13 = this->buffer_->ptr_ + sVar16;
    uVar7 = internal::CharTraits<char>::format_float<double>
                      (pcVar13,this->buffer_->capacity_ - sVar16,local_3a,uVar10,spec->precision_,
                       value);
    if ((int)uVar7 < 0) {
      pBVar4 = this->buffer_;
      bVar19 = true;
      uVar7 = uVar11;
      if (pBVar4->capacity_ != 0xffffffffffffffff) {
        (**pBVar4->_vptr_Buffer)(pBVar4,pBVar4->capacity_ + 1);
        uVar7 = uVar11;
      }
    }
    else {
      uVar17 = this->buffer_->capacity_;
      if (uVar7 + sVar16 < uVar17) {
        bVar19 = false;
      }
      else {
        bVar19 = true;
        if (uVar17 < uVar7 + sVar16 + 1) {
          (**this->buffer_->_vptr_Buffer)();
        }
      }
    }
    uVar11 = uVar7;
  } while (bVar19);
  cVar5 = (char)wVar3;
  if (cVar14 == '\0') {
    cVar14 = '\0';
    goto LAB_001587e1;
  }
  AVar2 = (spec->super_AlignSpec).align_;
  if (AVar2 == ALIGN_RIGHT) {
    cVar1 = *pcVar13;
joined_r0x001587d0:
    cVar6 = cVar5;
    if (cVar1 != ' ') goto LAB_001587d6;
  }
  else {
    if (AVar2 == ALIGN_DEFAULT) {
      cVar1 = *pcVar13;
      goto joined_r0x001587d0;
    }
LAB_001587d6:
    cVar6 = cVar14;
    cVar14 = '\0';
  }
  pcVar13[-1] = cVar6;
  uVar7 = uVar7 + 1;
LAB_001587e1:
  if ((spec->super_AlignSpec).align_ == ALIGN_CENTER) {
    uVar10 = (spec->super_AlignSpec).super_WidthSpec.width_;
    if (uVar7 < uVar10) {
      pBVar4 = this->buffer_;
      sVar16 = pBVar4->size_;
      uVar17 = sVar16 + uVar10;
      if (pBVar4->capacity_ < uVar17) {
        (**pBVar4->_vptr_Buffer)(pBVar4,uVar17);
      }
      pBVar4->size_ = uVar17;
      pcVar13 = this->buffer_->ptr_ + sVar16;
      uVar17 = (ulong)uVar7;
      memmove(pcVar13 + (uVar10 - uVar7 >> 1),pcVar13,uVar17);
      uVar10 = (spec->super_AlignSpec).super_WidthSpec.width_;
      uVar15 = uVar10 - uVar17;
      __n = uVar15 >> 1;
      uVar11 = wVar3 & 0xff;
      if (1 < uVar15) {
        memset(pcVar13,uVar11,__n);
      }
      if (uVar10 == uVar7) {
        return;
      }
      memset(pcVar13 + uVar17 + __n,uVar11,uVar15 - __n);
      return;
    }
  }
  if ((cVar14 != '\0') || ((spec->super_AlignSpec).super_WidthSpec.fill_ != L' ')) {
    cVar1 = *pcVar13;
    while (cVar1 == ' ') {
      *pcVar13 = cVar5;
      cVar1 = pcVar13[1];
      pcVar13 = pcVar13 + 1;
    }
    if (cVar14 != '\0') {
      pcVar13[-1] = cVar14;
    }
  }
  pBVar4 = this->buffer_;
  uVar17 = (ulong)uVar7 + pBVar4->size_;
  if (pBVar4->capacity_ < uVar17) {
    (**pBVar4->_vptr_Buffer)(pBVar4,uVar17);
  }
  pBVar4->size_ = uVar17;
  return;
}

Assistant:

void BasicWriter<Char>::write_double(T value, const FormatSpec &spec) {
  // Check type.
  char type = spec.type();
  bool upper = false;
  switch (type) {
  case 0:
    type = 'g';
    break;
  case 'e': case 'f': case 'g': case 'a':
    break;
  case 'F':
#if FMT_MSC_VER
    // MSVC's printf doesn't support 'F'.
    type = 'f';
#endif
    // Fall through.
  case 'E': case 'G': case 'A':
    upper = true;
    break;
  default:
    internal::report_unknown_type(type, "double");
    break;
  }

  char sign = 0;
  // Use isnegative instead of value < 0 because the latter is always
  // false for NaN.
  if (internal::FPUtil::isnegative(static_cast<double>(value))) {
    sign = '-';
    value = -value;
  } else if (spec.flag(SIGN_FLAG)) {
    sign = spec.flag(PLUS_FLAG) ? '+' : ' ';
  }

  if (internal::FPUtil::isnotanumber(value)) {
    // Format NaN ourselves because sprintf's output is not consistent
    // across platforms.
    std::size_t nan_size = 4;
    const char *nan = upper ? " NAN" : " nan";
    if (!sign) {
      --nan_size;
      ++nan;
    }
    CharPtr out = write_str(nan, nan_size, spec);
    if (sign)
      *out = sign;
    return;
  }

  if (internal::FPUtil::isinfinity(value)) {
    // Format infinity ourselves because sprintf's output is not consistent
    // across platforms.
    std::size_t inf_size = 4;
    const char *inf = upper ? " INF" : " inf";
    if (!sign) {
      --inf_size;
      ++inf;
    }
    CharPtr out = write_str(inf, inf_size, spec);
    if (sign)
      *out = sign;
    return;
  }

  std::size_t offset = buffer_.size();
  unsigned width = spec.width();
  if (sign) {
    buffer_.reserve(buffer_.size() + (width > 1u ? width : 1u));
    if (width > 0)
      --width;
    ++offset;
  }

  // Build format string.
  enum { MAX_FORMAT_SIZE = 10}; // longest format: %#-*.*Lg
  Char format[MAX_FORMAT_SIZE];
  Char *format_ptr = format;
  *format_ptr++ = '%';
  unsigned width_for_sprintf = width;
  if (spec.flag(HASH_FLAG))
    *format_ptr++ = '#';
  if (spec.align() == ALIGN_CENTER) {
    width_for_sprintf = 0;
  } else {
    if (spec.align() == ALIGN_LEFT)
      *format_ptr++ = '-';
    if (width != 0)
      *format_ptr++ = '*';
  }
  if (spec.precision() >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }

  append_float_length(format_ptr, value);
  *format_ptr++ = type;
  *format_ptr = '\0';

  // Format using snprintf.
  Char fill = internal::CharTraits<Char>::cast(spec.fill());
  unsigned n = 0;
  Char *start = 0;
  for (;;) {
    std::size_t buffer_size = buffer_.capacity() - offset;
#if FMT_MSC_VER
    // MSVC's vsnprintf_s doesn't work with zero size, so reserve
    // space for at least one extra character to make the size non-zero.
    // Note that the buffer's capacity will increase by more than 1.
    if (buffer_size == 0) {
      buffer_.reserve(offset + 1);
      buffer_size = buffer_.capacity() - offset;
    }
#endif
    start = &buffer_[offset];
    int result = internal::CharTraits<Char>::format_float(
        start, buffer_size, format, width_for_sprintf, spec.precision(), value);
    if (result >= 0) {
      n = internal::to_unsigned(result);
      if (offset + n < buffer_.capacity())
        break;  // The buffer is large enough - continue with formatting.
      buffer_.reserve(offset + n + 1);
    } else {
      // If result is negative we ask to increase the capacity by at least 1,
      // but as std::vector, the buffer grows exponentially.
      buffer_.reserve(buffer_.capacity() + 1);
    }
  }
  if (sign) {
    if ((spec.align() != ALIGN_RIGHT && spec.align() != ALIGN_DEFAULT) ||
        *start != ' ') {
      *(start - 1) = sign;
      sign = 0;
    } else {
      *(start - 1) = fill;
    }
    ++n;
  }
  if (spec.align() == ALIGN_CENTER && spec.width() > n) {
    width = spec.width();
    CharPtr p = grow_buffer(width);
    std::memmove(get(p) + (width - n) / 2, get(p), n * sizeof(Char));
    fill_padding(p, spec.width(), n, fill);
    return;
  }
  if (spec.fill() != ' ' || sign) {
    while (*start == ' ')
      *start++ = fill;
    if (sign)
      *(start - 1) = sign;
  }
  grow_buffer(n);
}